

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PresolveComponent.h
# Opt level: O3

void __thiscall PresolveComponentData::~PresolveComponentData(PresolveComponentData *this)

{
  pointer pHVar1;
  pointer pHVar2;
  pointer pcVar3;
  pointer pdVar4;
  pointer pNVar5;
  pointer puVar6;
  pointer piVar7;
  pointer ppVar8;
  pointer pcVar9;
  
  this->_vptr_PresolveComponentData = (_func_int **)&PTR__PresolveComponentData_004408c0;
  pHVar1 = (this->presolve_log_).rule.
           super__Vector_base<HighsPresolveRuleLog,_std::allocator<HighsPresolveRuleLog>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pHVar1 != (pointer)0x0) {
    operator_delete(pHVar1);
  }
  pHVar2 = (this->recovered_basis_).row_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pHVar2 != (pointer)0x0) {
    operator_delete(pHVar2);
  }
  pHVar2 = (this->recovered_basis_).col_status.
           super__Vector_base<HighsBasisStatus,_std::allocator<HighsBasisStatus>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (pHVar2 != (pointer)0x0) {
    operator_delete(pHVar2);
  }
  pcVar3 = (this->recovered_basis_).debug_origin_name._M_dataplus._M_p;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar3 != &(this->recovered_basis_).debug_origin_name.field_2) {
    operator_delete(pcVar3);
  }
  pdVar4 = (this->recovered_solution_).row_dual.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  pdVar4 = (this->recovered_solution_).row_value.super__Vector_base<double,_std::allocator<double>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  pdVar4 = (this->recovered_solution_).col_dual.super__Vector_base<double,_std::allocator<double>_>.
           _M_impl.super__Vector_impl_data._M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  pdVar4 = (this->recovered_solution_).col_value.super__Vector_base<double,_std::allocator<double>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pdVar4 != (pointer)0x0) {
    operator_delete(pdVar4);
  }
  pNVar5 = (this->postSolveStack).colValues.
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar5 != (pointer)0x0) {
    operator_delete(pNVar5);
  }
  pNVar5 = (this->postSolveStack).rowValues.
           super__Vector_base<presolve::HighsPostsolveStack::Nonzero,_std::allocator<presolve::HighsPostsolveStack::Nonzero>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (pNVar5 != (pointer)0x0) {
    operator_delete(pNVar5);
  }
  puVar6 = (this->postSolveStack).linearlyTransformable.
           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (puVar6 != (pointer)0x0) {
    operator_delete(puVar6);
  }
  piVar7 = (this->postSolveStack).origRowIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7);
  }
  piVar7 = (this->postSolveStack).origColIndex.super__Vector_base<int,_std::allocator<int>_>._M_impl
           .super__Vector_impl_data._M_start;
  if (piVar7 != (pointer)0x0) {
    operator_delete(piVar7);
  }
  ppVar8 = (this->postSolveStack).reductions.
           super__Vector_base<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>,_std::allocator<std::pair<presolve::HighsPostsolveStack::ReductionType,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  if (ppVar8 != (pointer)0x0) {
    operator_delete(ppVar8);
  }
  pcVar9 = (this->postSolveStack).reductionValues.data.
           super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data._M_start;
  if (pcVar9 != (pointer)0x0) {
    operator_delete(pcVar9);
  }
  HighsLp::~HighsLp(&this->reduced_lp_);
  return;
}

Assistant:

virtual ~PresolveComponentData() = default;